

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t RelativeMonth(time_t Start,time_t Timezone,time_t RelMonth)

{
  time_t Start_00;
  tm *ptVar1;
  long lVar2;
  time_t Future;
  undefined1 local_78 [8];
  tm tmbuf;
  time_t Year;
  time_t Month;
  tm *tm;
  time_t RelMonth_local;
  time_t Timezone_local;
  time_t Start_local;
  
  if (RelMonth == 0) {
    Start_local = 0;
  }
  else {
    Timezone_local = Start;
    ptVar1 = localtime_r(&Timezone_local,(tm *)local_78);
    Start_00 = Timezone_local;
    lVar2 = ((ptVar1->tm_year + 0x76c) * 0xc + ptVar1->tm_mon) + RelMonth;
    tmbuf.tm_zone = (char *)(lVar2 / 0xc);
    Future = Convert(lVar2 % 0xc + 1,(long)ptVar1->tm_mday,(time_t)tmbuf.tm_zone,
                     (long)ptVar1->tm_hour,(long)ptVar1->tm_min,(long)ptVar1->tm_sec,Timezone,
                     DSTmaybe);
    Start_local = DSTcorrect(Start_00,Future);
  }
  return Start_local;
}

Assistant:

static time_t
RelativeMonth(time_t Start, time_t Timezone, time_t RelMonth)
{
	struct tm	*tm;
	time_t	Month;
	time_t	Year;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm	tmbuf;
#endif

	if (RelMonth == 0)
		return 0;
#if defined(HAVE_LOCALTIME_S)
	tm = localtime_s(&tmbuf, &Start) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&Start, &tmbuf);
#else
	tm = localtime(&Start);
#endif
	Month = 12 * (tm->tm_year + 1900) + tm->tm_mon + RelMonth;
	Year = Month / 12;
	Month = Month % 12 + 1;
	return DSTcorrect(Start,
	    Convert(Month, (time_t)tm->tm_mday, Year,
		(time_t)tm->tm_hour, (time_t)tm->tm_min, (time_t)tm->tm_sec,
		Timezone, DSTmaybe));
}